

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

FString __thiscall Stat_fps::GetStats(Stat_fps *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Stat_fps *this_local;
  FString *out;
  
  FString::FString((FString *)this);
  dVar1 = cycle_t::TimeMS(&FrameCycles);
  dVar2 = cycle_t::TimeMS(&WallCycles);
  dVar3 = cycle_t::TimeMS(&PlaneCycles);
  dVar4 = cycle_t::TimeMS(&MaskedCycles);
  FString::Format((FString *)this,
                  "frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms",dVar1,dVar2
                  ,dVar3,dVar4);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (fps)
{
	FString out;
	out.Format("frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms",
		FrameCycles.TimeMS(), WallCycles.TimeMS(), PlaneCycles.TimeMS(), MaskedCycles.TimeMS());
	return out;
}